

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

void TestKLPConstructorGraph<unsigned_long,double>
               (Polynomial<unsigned_long,_double> *polynomial,string *type)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  runtime_error *this;
  unsigned_long *puVar4;
  _Vector_base<int,_std::allocator<int>_> _Stack_2b08;
  double local_2af0;
  Binaries init_spins;
  Polynomial<double> local_2ad0;
  Polynomial<double> poly_graph;
  KLocalPolynomial<openjij::graph::Polynomial<double>_> system;
  BinaryPolynomialModel<unsigned_long,_double> bpm_cimod;
  random_device rnd;
  mt19937 mt;
  
  cimod::BinaryPolynomialModel<unsigned_long,_double>::BinaryPolynomialModel
            (&bpm_cimod,polynomial,BINARY);
  poly_graph.poly_key_inv_._M_h._M_buckets = &poly_graph.poly_key_inv_._M_h._M_single_bucket;
  poly_graph.super_Graph._num_spins = 3;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poly_graph.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  poly_graph.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poly_graph.poly_key_inv_._M_h._M_bucket_count = 1;
  poly_graph.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  poly_graph.poly_key_inv_._M_h._M_element_count = 0;
  poly_graph.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  poly_graph.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
  poly_graph.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cimod::BinaryPolynomialModel<unsigned_long,_double>::GetPolynomial
            ((Polynomial<unsigned_long,_double> *)&rnd,&bpm_cimod);
  puVar4 = rnd.field_0._M_mt._M_x + 2;
  while (puVar4 = (unsigned_long *)*puVar4, puVar4 != (unsigned_long *)0x0) {
    local_2af0 = (double)puVar4[4];
    pdVar3 = openjij::graph::Polynomial<double>::J
                       (&poly_graph,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar4 + 1));
    *pdVar3 = local_2af0;
  }
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&rnd);
  std::random_device::random_device(&rnd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar2);
  openjij::graph::Graph::
  gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&init_spins,&poly_graph.super_Graph,&mt);
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::KLocalPolynomial
            (&system,&init_spins,&poly_graph);
  bVar1 = std::operator==(type,"Dense");
  if (bVar1) {
    TestKLPSystemDense<double>(&system);
    local_2ad0.poly_key_inv_._M_h._M_buckets = &local_2ad0.poly_key_inv_._M_h._M_single_bucket;
    local_2ad0.super_Graph._num_spins = 3;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2ad0.poly_key_inv_._M_h._M_bucket_count = 1;
    local_2ad0.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2ad0.poly_key_inv_._M_h._M_element_count = 0;
    local_2ad0.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2ad0.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
    local_2ad0.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&_Stack_2b08,&local_2ad0.super_Graph,&mt);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              (&system,(Binaries *)&_Stack_2b08);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_2b08);
    openjij::graph::Polynomial<double>::~Polynomial(&local_2ad0);
    TestKLPSystemDense<double>(&system);
  }
  else {
    bVar1 = std::operator==(type,"Sparse");
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestKLPSystemSparse<double>(&system);
    local_2ad0.poly_key_inv_._M_h._M_buckets = &local_2ad0.poly_key_inv_._M_h._M_single_bucket;
    local_2ad0.super_Graph._num_spins = 3;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2ad0.poly_key_list_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2ad0.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2ad0.poly_key_inv_._M_h._M_bucket_count = 1;
    local_2ad0.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2ad0.poly_key_inv_._M_h._M_element_count = 0;
    local_2ad0.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2ad0.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
    local_2ad0.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((Binaries *)&_Stack_2b08,&local_2ad0.super_Graph,&mt);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              (&system,(Binaries *)&_Stack_2b08);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_2b08);
    openjij::graph::Polynomial<double>::~Polynomial(&local_2ad0);
    TestKLPSystemSparse<double>(&system);
  }
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::~KLocalPolynomial(&system)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&init_spins.super__Vector_base<int,_std::allocator<int>_>);
  std::random_device::~random_device(&rnd);
  openjij::graph::Polynomial<double>::~Polynomial(&poly_graph);
  cimod::BinaryPolynomialModel<unsigned_long,_double>::~BinaryPolynomialModel(&bpm_cimod);
  return;
}

Assistant:

void TestKLPConstructorGraph(const cimod::Polynomial<IndexType, FloatType> &polynomial, std::string type) {
   cimod::BinaryPolynomialModel<IndexType, FloatType> bpm_cimod(polynomial, cimod::Vartype::BINARY);
   openjij::graph::Polynomial<FloatType> poly_graph(3);
   for (const auto &it: bpm_cimod.GetPolynomial()) {
      poly_graph.J(it.first) = it.second;
   }
   std::random_device rnd;
   std::mt19937 mt(rnd());
   openjij::graph::Binaries init_spins = poly_graph.gen_binary(mt);
   
   auto system = openjij::system::make_k_local_polynomial(init_spins, poly_graph);
   if (type == "Dense") {
      TestKLPSystemDense(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemDense(system);
   }
   else if (type == "Sparse") {
      TestKLPSystemSparse(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemSparse(system);
   }
   else {
      throw std::runtime_error("Unknown type");
   }
}